

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::DragIntN(char *label,int *v,int components,float v_speed,int v_min,int v_max,
                    char *display_format)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  char *pcVar6;
  ulong uVar7;
  float w_full;
  float fVar8;
  float local_44;
  float local_40;
  float local_3c;
  char *local_38;
  
  pIVar2 = GImGui;
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  if (pIVar1->SkipItems == false) {
    local_3c = v_speed;
    BeginGroup();
    local_38 = label;
    PushID(label);
    PushMultiItemsWidths(components,w_full);
    if (components < 1) {
      bVar5 = false;
    }
    else {
      pcVar6 = "%.0f";
      if (display_format != (char *)0x0) {
        pcVar6 = display_format;
      }
      local_40 = (float)v_min;
      uVar7 = 0;
      bVar5 = false;
      do {
        PushID((int)uVar7);
        local_44 = (float)v[uVar7];
        bVar4 = DragFloat("##v",&local_44,local_3c,local_40,(float)v_max,pcVar6,1.0);
        v[uVar7] = (int)local_44;
        pIVar3 = GImGui;
        fVar8 = (pIVar2->Style).ItemInnerSpacing.x;
        pIVar1 = GImGui->CurrentWindow;
        pIVar1->Accessed = true;
        if (pIVar1->SkipItems == false) {
          if (fVar8 < 0.0) {
            fVar8 = (pIVar3->Style).ItemSpacing.x;
          }
          (pIVar1->DC).CursorPos.x = fVar8 + (pIVar1->DC).CursorPosPrevLine.x;
          (pIVar1->DC).CursorPos.y = (pIVar1->DC).CursorPosPrevLine.y;
          (pIVar1->DC).CurrentLineHeight = (pIVar1->DC).PrevLineHeight;
          (pIVar1->DC).CurrentLineTextBaseOffset = (pIVar1->DC).PrevLineTextBaseOffset;
        }
        bVar5 = (bool)(bVar5 | bVar4);
        PopID();
        PopItemWidth();
        uVar7 = uVar7 + 1;
      } while ((uint)components != uVar7);
    }
    PopID();
    pcVar6 = local_38;
    if (local_38 != (char *)0xffffffffffffffff) {
      do {
        if (*pcVar6 == '#') {
          if (pcVar6[1] == '#') goto LAB_00145311;
        }
        else if (*pcVar6 == '\0') goto LAB_00145311;
        pcVar6 = pcVar6 + 1;
      } while (pcVar6 != (char *)0xffffffffffffffff);
      pcVar6 = (char *)0xffffffffffffffff;
    }
LAB_00145311:
    TextUnformatted(local_38,pcVar6);
    EndGroup();
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ImGui::DragIntN(const char* label, int* v, int components, float v_speed, int v_min, int v_max, const char* display_format)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    bool value_changed = false;
    BeginGroup();
    PushID(label);
    PushMultiItemsWidths(components);
    for (int i = 0; i < components; i++)
    {
        PushID(i);
        value_changed |= DragInt("##v", &v[i], v_speed, v_min, v_max, display_format);
        SameLine(0, g.Style.ItemInnerSpacing.x);
        PopID();
        PopItemWidth();
    }
    PopID();

    TextUnformatted(label, FindRenderedTextEnd(label));
    EndGroup();

    return value_changed;
}